

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall
Graph::insertEdge(Graph *this,int originID,int destinyID,int id,double resist,double react,bool swit
                 )

{
  Vertex **ppVVar1;
  Edge *this_00;
  Vertex *pVVar2;
  Vertex *pVVar3;
  
  pVVar2 = this->verticesList;
  pVVar3 = pVVar2;
  if (pVVar2 == (Vertex *)0x0) {
    pVVar3 = (Vertex *)0x0;
  }
  else {
    do {
      if (pVVar3->id == originID) goto LAB_00102a37;
      ppVVar1 = &pVVar3->nextVertex;
      pVVar3 = *ppVVar1;
    } while (*ppVVar1 != (Vertex *)0x0);
    pVVar3 = (Vertex *)0x0;
LAB_00102a37:
    do {
      if (pVVar2->id == destinyID) goto LAB_00102a4f;
      pVVar2 = pVVar2->nextVertex;
    } while (pVVar2 != (Vertex *)0x0);
  }
  pVVar2 = (Vertex *)0x0;
LAB_00102a4f:
  this_00 = (Edge *)operator_new(0x60);
  Edge::Edge(this_00,id);
  this_00->destiny = pVVar2;
  this_00->origin = pVVar3;
  this_00->nextEdge = pVVar3->edgesList;
  pVVar3->edgesList = this_00;
  this_00->resistance = resist;
  this_00->reactance = react;
  this_00->closed = swit;
  pVVar3->outdegree = pVVar3->outdegree + 1;
  pVVar2->indegree = pVVar2->indegree + 1;
  this->edgesSize = this->edgesSize + 1;
  return;
}

Assistant:

void Graph::insertEdge(int originID, int destinyID, int id, double resist, double react, bool swit){
    Vertex *originVertex = findVertex(originID);
    Vertex *destinyVertex = findVertex(destinyID);
    Edge *newEdge = new Edge(id);
    newEdge->setDestiny(destinyVertex);
    newEdge->setOrigin(originVertex);

    // Insere Arco no inicio da lista
    newEdge->setNext(originVertex->getEdgesList());
    originVertex->setEdgesList(newEdge);
    newEdge->setResistance(resist);
    newEdge->setReactance(react);
    newEdge->setSwitch(swit);

    originVertex->setOutdegree(originVertex->getIndegree() + 1);
    destinyVertex->setIndegree(destinyVertex->getOutdegree() + 1);

    this->edgesSize++;
}